

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O1

int __thiscall Cleaner::CleanRules(Cleaner *this,int rule_count,char **rules)

{
  Verbosity VVar1;
  char *__s;
  State *pSVar2;
  Rule *rule;
  ulong uVar3;
  allocator<char> local_59;
  char **local_58;
  string local_50;
  
  local_58 = rules;
  if (rules != (char **)0x0) {
    this->status_ = 0;
    this->cleaned_files_count_ = 0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->removed_)._M_t);
    std::
    _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>::
    clear(&(this->cleaned_)._M_t);
    PrintHeader(this);
    LoadDyndeps(this);
    if (0 < rule_count) {
      uVar3 = 0;
      do {
        __s = local_58[uVar3];
        pSVar2 = this->state_;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_59);
        rule = BindingEnv::LookupRule(&pSVar2->bindings_,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (rule == (Rule *)0x0) {
          Error("unknown rule \'%s\'",__s);
          this->status_ = 1;
        }
        else {
          VVar1 = this->config_->verbosity;
          if ((VVar1 != QUIET) && ((VVar1 == VERBOSE || (this->config_->dry_run == true)))) {
            printf("Rule %s\n",__s);
          }
          DoCleanRule(this,rule);
        }
        uVar3 = uVar3 + 1;
      } while ((uint)rule_count != uVar3);
    }
    if (this->config_->verbosity != QUIET) {
      printf("%d files.\n",(ulong)(uint)this->cleaned_files_count_);
    }
    return this->status_;
  }
  __assert_fail("rules",
                "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean.cc"
                ,0xfe,"int Cleaner::CleanRules(int, char **)");
}

Assistant:

int Cleaner::CleanRules(int rule_count, char* rules[]) {
  assert(rules);

  Reset();
  PrintHeader();
  LoadDyndeps();
  for (int i = 0; i < rule_count; ++i) {
    const char* rule_name = rules[i];
    const Rule* rule = state_->bindings_.LookupRule(rule_name);
    if (rule) {
      if (IsVerbose())
        printf("Rule %s\n", rule_name);
      DoCleanRule(rule);
    } else {
      Error("unknown rule '%s'", rule_name);
      status_ = 1;
    }
  }
  PrintFooter();
  return status_;
}